

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign<float>
          (CImg<unsigned_int> *this,float *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint *puVar1;
  float fVar2;
  uint *puVar3;
  long lVar4;
  
  if ((values == (float *)0x0) ||
     ((ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x == 0)) {
    if ((this->_is_shared == false) && (this->_data != (uint *)0x0)) {
      operator_delete__(this->_data);
    }
    this->_data = (uint *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
  }
  else {
    assign(this,size_x,size_y,size_z,size_c);
    lVar4 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    if (0 < lVar4) {
      puVar3 = this->_data;
      puVar1 = puVar3 + lVar4;
      do {
        fVar2 = *values;
        values = values + 1;
        *puVar3 = (uint)(long)fVar2;
        puVar3 = puVar3 + 1;
      } while (puVar3 < puVar1);
    }
  }
  return this;
}

Assistant:

CImg<T>& assign(const t *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      assign(size_x,size_y,size_z,size_c);
      const t *ptrs = values; cimg_for(*this,ptrd,T) *ptrd = (T)*(ptrs++);
      return *this;
    }